

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O2

int lookup_address(SOCKET_IO_INSTANCE *socket_io_instance)

{
  _Bool _Var1;
  int in_EAX;
  undefined3 extraout_var;
  
  if (socket_io_instance->address_type == ADDRESS_TYPE_IP) {
    _Var1 = dns_resolver_is_lookup_complete(socket_io_instance->dns_resolver);
    in_EAX = CONCAT31(extraout_var,_Var1);
    if (!_Var1) {
      socket_io_instance->io_state = IO_STATE_OPENING;
      return in_EAX;
    }
  }
  socket_io_instance->io_state = IO_STATE_OPEN;
  return in_EAX;
}

Assistant:

static int lookup_address(SOCKET_IO_INSTANCE* socket_io_instance)
{
    int result = 0;

    if (socket_io_instance->address_type == ADDRESS_TYPE_IP)
    {
        if (!dns_resolver_is_lookup_complete(socket_io_instance->dns_resolver))
        {
            socket_io_instance->io_state = IO_STATE_OPENING;
        }
        else
        {
            socket_io_instance->io_state = IO_STATE_OPEN;
        }
    }
    else //ADDRESS_TYPE_DOMAIN_SOCKET
    {
        socket_io_instance->io_state = IO_STATE_OPEN;
    }

    return result;
}